

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pStateChangeTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Performance::anon_unknown_0::StateChangeCase::renderReference
          (StateChangeCase *this,Functions *gl)

{
  int iVar1;
  
  iVar1 = 0;
  (*(this->super_StateChangePerformanceCase).super_TestCase.super_TestNode._vptr_TestNode[8])
            (this,gl,0);
  if (0 < (this->super_StateChangePerformanceCase).m_callCount) {
    do {
      deqp::gls::StateChangePerformanceCase::callDraw(&this->super_StateChangePerformanceCase,gl);
      iVar1 = iVar1 + 1;
    } while (iVar1 < (this->super_StateChangePerformanceCase).m_callCount);
  }
  (*(this->super_StateChangePerformanceCase).super_TestCase.super_TestNode._vptr_TestNode[8])
            (this,gl,1);
  if (0 < (this->super_StateChangePerformanceCase).m_callCount) {
    iVar1 = 0;
    do {
      deqp::gls::StateChangePerformanceCase::callDraw(&this->super_StateChangePerformanceCase,gl);
      iVar1 = iVar1 + 1;
    } while (iVar1 < (this->super_StateChangePerformanceCase).m_callCount);
  }
  return;
}

Assistant:

void StateChangeCase::renderReference (const glw::Functions& gl)
{
	changeState(gl, 0);

	for (int callNdx = 0; callNdx < m_callCount; callNdx++)
		callDraw(gl);

	changeState(gl, 1);

	for (int callNdx = 0; callNdx < m_callCount; callNdx++)
		callDraw(gl);
}